

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O3

void __thiscall
boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
split_iterator<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                End,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *Finder)

{
  ulong __n;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *__src;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  token_compress_mode_type local_30;
  
  __dest = &local_48;
  __n = (Finder->m_Pred).m_Size;
  local_48.m_dynSet = (set_value_type *)0x0;
  __src = Finder;
  local_38 = __n;
  if (0x10 < __n) {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(__n);
    __src = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)
            (Finder->m_Pred).m_Storage.m_dynSet;
    local_48.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,__src,__n);
  local_30 = Finder->m_eCompress;
  detail::find_iterator_base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
  find_iterator_base<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            ((find_iterator_base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>> *)this,
             (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)&local_48,0);
  if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_48.m_dynSet);
  }
  *(char **)(this + 0x20) = Begin._M_current;
  *(char **)(this + 0x28) = Begin._M_current;
  *(char **)(this + 0x30) = Begin._M_current;
  *(char **)(this + 0x38) = End._M_current;
  this[0x40] = (split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>)0x0;
  if (Begin._M_current != End._M_current) {
    split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increment((split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
  }
  return;
}

Assistant:

split_iterator(
                    IteratorT Begin,
                    IteratorT End,
                    FinderT Finder ) :
                detail::find_iterator_base<IteratorT>(Finder,0),
                m_Match(Begin,Begin),
                m_Next(Begin),
                m_End(End),
                m_bEof(false)
            {
                // force the correct behavior for empty sequences and yield at least one token
                if(Begin!=End)
                {
                    increment();
                }
            }